

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Cond<float>::doApply
          (IRet *__return_storage_ptr__,Cond<float> *this,EvalContext *param_1,IArgs *iargs)

{
  double dVar1;
  Interval *pIVar2;
  Interval *pIVar3;
  undefined1 uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  
  __return_storage_ptr__->m_hasNaN = false;
  dVar8 = INFINITY;
  dVar9 = -INFINITY;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  pIVar2 = iargs->a;
  dVar1 = pIVar2->m_lo;
  if ((1.0 < dVar1) || (pIVar2->m_hi < 1.0)) {
    bVar5 = 0;
  }
  else {
    pIVar3 = iargs->b;
    bVar5 = pIVar3->m_hasNaN;
    uVar6 = -(ulong)(INFINITY <= pIVar3->m_lo);
    uVar7 = -(ulong)(pIVar3->m_hi <= -INFINITY);
    dVar8 = (double)(uVar6 & 0x7ff0000000000000 | ~uVar6 & (ulong)pIVar3->m_lo);
    dVar9 = (double)(uVar7 & 0xfff0000000000000 | ~uVar7 & (ulong)pIVar3->m_hi);
    __return_storage_ptr__->m_hasNaN = (bool)bVar5;
    __return_storage_ptr__->m_lo = dVar8;
    __return_storage_ptr__->m_hi = dVar9;
  }
  if ((dVar1 <= 0.0) && (0.0 <= pIVar2->m_hi)) {
    pIVar2 = iargs->c;
    uVar4 = true;
    if ((bVar5 & 1) == 0) {
      uVar4 = (undefined1)*(undefined4 *)pIVar2;
    }
    __return_storage_ptr__->m_hasNaN = (bool)uVar4;
    dVar1 = pIVar2->m_hi;
    uVar6 = -(ulong)(dVar8 <= pIVar2->m_lo);
    uVar7 = -(ulong)(dVar1 <= dVar9);
    __return_storage_ptr__->m_lo = (double)(~uVar6 & (ulong)pIVar2->m_lo | (ulong)dVar8 & uVar6);
    __return_storage_ptr__->m_hi = (double)(~uVar7 & (ulong)dVar1 | (ulong)dVar9 & uVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply	(const EvalContext&, const IArgs& iargs)const
	{
		IRet	ret;

		if (iargs.a.contains(true))
			ret = unionIVal<T>(ret, iargs.b);

		if (iargs.a.contains(false))
			ret = unionIVal<T>(ret, iargs.c);

		return ret;
	}